

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O0

void __thiscall Storage::Disk::IPF::IPF(IPF *this,string *file_name)

{
  bool bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Density DVar5;
  long lVar6;
  undefined4 *puVar7;
  pointer ppVar8;
  pointer ppVar9;
  long lVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_bool>
  pVar11;
  _Self local_120;
  _Self local_118;
  iterator description_1;
  _Self local_108;
  iterator pair_1;
  uint32_t data_key_1;
  uint32_t local_e4;
  TrackDescription *pTStack_e0;
  uint32_t data_key;
  TrackDescription *description;
  undefined1 local_d0;
  TrackDescription local_c8;
  _Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>
  local_a8;
  pair<std::_Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_bool>
  pair;
  Address local_90;
  Address address;
  uint32_t side;
  uint32_t track;
  uint8_t platform;
  int c;
  uint32_t media_type;
  uint32_t crc;
  uint32_t length;
  uint32_t type;
  long start_of_block;
  map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
  tracks_by_data_key;
  string *file_name_local;
  IPF *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  TargetPlatform::TypeDistinguisher::TypeDistinguisher(&this->super_TypeDistinguisher);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__IPF_00caa3e8;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_00caa448;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  std::
  map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
  ::map(&this->tracks_);
  this->is_sps_format_ = false;
  this->platform_type_ = 0x80;
  std::
  map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
  ::map((map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
         *)&start_of_block);
  while( true ) {
    lVar6 = FileHolder::tell(&this->file_);
    uVar3 = FileHolder::get32be(&this->file_);
    media_type = FileHolder::get32be(&this->file_);
    FileHolder::get32be(&this->file_);
    bVar1 = FileHolder::eof(&this->file_);
    if (bVar1) {
      std::
      map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
      ::~map((map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
              *)&start_of_block);
      return;
    }
    if ((lVar6 == 0) &&
       (uVar4 = anon_unknown.dwarf_f1c1f8::block((char (*) [5])"CAPS"), uVar3 != uVar4)) break;
    if (uVar3 == 0x43415053) {
      if (lVar6 != 0) {
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0xfffffffe;
        __cxa_throw(puVar7,&Error::typeinfo,0);
      }
    }
    else if (uVar3 == 0x44415441) {
      uVar3 = FileHolder::get32be(&this->file_);
      media_type = media_type + uVar3;
      FileHolder::seek(&this->file_,8,1);
      pair_1._M_node._4_4_ = FileHolder::get32be(&this->file_);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
           ::find((map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
                   *)&start_of_block,(key_type_conflict *)((long)&pair_1._M_node + 4));
      description_1._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
           ::end((map<unsigned_int,_Storage::Disk::Track::Address,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>_>
                  *)&start_of_block);
      bVar1 = std::operator==(&local_108,(_Self *)&description_1);
      if (!bVar1) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_int,_Storage::Disk::Track::Address>_>::
                 operator->(&local_108);
        local_118._M_node =
             (_Base_ptr)
             std::
             map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
             ::find(&this->tracks_,&ppVar9->second);
        local_120._M_node =
             (_Base_ptr)
             std::
             map<Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
             ::end(&this->tracks_);
        bVar1 = std::operator==(&local_118,&local_120);
        if (!bVar1) {
          lVar10 = FileHolder::tell(&this->file_);
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>
                   ::operator->(&local_118);
          (ppVar8->second).file_offset = lVar10;
        }
      }
    }
    else if (uVar3 == 0x494d4745) {
      address.position.position_ = FileHolder::get32be(&this->file_);
      uVar3 = FileHolder::get32be(&this->file_);
      address.head = uVar3;
      HeadPosition::HeadPosition((HeadPosition *)&pair.field_0xc,address.position.position_);
      Track::Address::Address(&local_90,uVar3,(HeadPosition)pair._12_4_);
      local_c8.data_bits = 0;
      local_c8.gap_bits = 0;
      local_c8.block_count = 0;
      local_c8.has_fuzzy_bits = false;
      local_c8._29_3_ = 0;
      local_c8.file_offset = 0;
      local_c8.density = Unknown;
      local_c8.start_bit_pos = 0;
      TrackDescription::TrackDescription(&local_c8);
      pVar11 = std::
               map<Storage::Disk::Track::Address,Storage::Disk::IPF::TrackDescription,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>>
               ::emplace<Storage::Disk::Track::Address_const&,Storage::Disk::IPF::TrackDescription>
                         ((map<Storage::Disk::Track::Address,Storage::Disk::IPF::TrackDescription,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,Storage::Disk::IPF::TrackDescription>>>
                           *)&this->tracks_,&local_90,&local_c8);
      description = (TrackDescription *)pVar11.first._M_node;
      local_d0 = pVar11.second;
      local_a8._M_node = (_Base_ptr)description;
      pair.first._M_node._0_1_ = local_d0;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>
               ::operator->(&local_a8);
      pTStack_e0 = &ppVar8->second;
      DVar5 = FileHolder::get32be(&this->file_);
      pTStack_e0->density = DVar5;
      if (9 < (int)pTStack_e0->density) {
        pTStack_e0->density = Unknown;
      }
      FileHolder::seek(&this->file_,0xc,1);
      uVar3 = FileHolder::get32be(&this->file_);
      pTStack_e0->start_bit_pos = uVar3;
      uVar3 = FileHolder::get32be(&this->file_);
      pTStack_e0->data_bits = uVar3;
      uVar3 = FileHolder::get32be(&this->file_);
      pTStack_e0->gap_bits = uVar3;
      FileHolder::seek(&this->file_,4,1);
      uVar3 = FileHolder::get32be(&this->file_);
      pTStack_e0->block_count = uVar3;
      FileHolder::seek(&this->file_,4,1);
      uVar3 = FileHolder::get32be(&this->file_);
      pTStack_e0->has_fuzzy_bits = (bool)((byte)uVar3 & 1);
      local_e4 = FileHolder::get32be(&this->file_);
      std::
      map<unsigned_int,Storage::Disk::Track::Address,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>>
      ::emplace<unsigned_int_const&,Storage::Disk::Track::Address_const&>
                ((map<unsigned_int,Storage::Disk::Track::Address,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Storage::Disk::Track::Address>>>
                  *)&start_of_block,&local_e4,&local_90);
    }
    else if (uVar3 == 0x494e464f) {
      uVar3 = FileHolder::get32be(&this->file_);
      if (uVar3 != 1) {
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0xfffffffe;
        __cxa_throw(puVar7,&Error::typeinfo,0);
      }
      uVar3 = FileHolder::get32be(&this->file_);
      this->is_sps_format_ = 1 < uVar3;
      FileHolder::seek(&this->file_,0x14,1);
      uVar3 = FileHolder::get32be(&this->file_);
      this->track_count_ = uVar3 + 1;
      FileHolder::seek(&this->file_,4,1);
      uVar3 = FileHolder::get32be(&this->file_);
      this->head_count_ = uVar3 + 1;
      FileHolder::seek(&this->file_,8,1);
      this->platform_type_ = 0;
      for (track = 0; (int)track < 4; track = track + 1) {
        uVar2 = FileHolder::get8(&this->file_);
        switch(uVar2) {
        case '\x01':
          this->platform_type_ = this->platform_type_ | 0x80;
          break;
        case '\x02':
          this->platform_type_ = this->platform_type_ | 0x10;
          break;
        default:
          break;
        case '\x04':
          this->platform_type_ = this->platform_type_ | 1;
          break;
        case '\x05':
          this->platform_type_ = this->platform_type_ | 0x200000;
        }
      }
      if (this->platform_type_ == 0) {
        this->platform_type_ = -1;
      }
    }
    else {
      printf("Ignoring %c%c%c%c, starting at %ld of length %d\n",(ulong)(uVar3 >> 0x18),
             (ulong)(uVar3 >> 0x10 & 0xff),(ulong)(byte)(uVar3 >> 8),(ulong)(uVar3 & 0xff),lVar6,
             media_type);
    }
    FileHolder::seek(&this->file_,lVar6 + (ulong)media_type,0);
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0xfffffffe;
  __cxa_throw(puVar7,&Error::typeinfo,0);
}

Assistant:

IPF::IPF(const std::string &file_name) : file_(file_name) {
	std::map<uint32_t, Track::Address> tracks_by_data_key;

	// For now, just build up a list of tracks that exist, noting the file position at which their data begins
	// plus the other fields that'll be necessary to convert them into flux on demand later.
	while(true) {
		const auto start_of_block = file_.tell();
		const uint32_t type = file_.get32be();
		uint32_t length = file_.get32be();						// Can't be const because of the dumb encoding of DATA blocks.
		[[maybe_unused]] const uint32_t crc = file_.get32be();
		if(file_.eof()) break;

		// Sanity check: the first thing in a file should be the CAPS record.
		if(!start_of_block && type != block("CAPS")) {
			throw Error::InvalidFormat;
		}

		switch(type) {
			default:
				printf("Ignoring %c%c%c%c, starting at %ld of length %d\n", (type >> 24), (type >> 16) & 0xff, (type >> 8) & 0xff, type & 0xff, start_of_block, length);
			break;

			case block("CAPS"):
				// Analogously to the sanity check above, if a CAPS block is anywhere other
				// than first then something is amiss.
				if(start_of_block) {
					throw Error::InvalidFormat;
				}
			break;

			case block("INFO"): {
				// There are a lot of useful archival fields in the info chunk, which for emulation
				// aren't that interesting.

				// Make sure this is a floppy disk.
				const uint32_t media_type = file_.get32be();
				if(media_type != 1) {
					throw Error::InvalidFormat;
				}

				// Determine whether this is a newer SPS-style file.
				is_sps_format_ = file_.get32be() > 1;

				// Skip: revision, file key and revision, CRC of the original .ctr, and minimum track.
				file_.seek(20, SEEK_CUR);
				track_count_ = int(1 + file_.get32be());

				// Skip: min side.
				file_.seek(4, SEEK_CUR);
				head_count_ = int(1 + file_.get32be());

				// Skip: creation date, time.
				file_.seek(8, SEEK_CUR);

				platform_type_ = 0;
				for(int c = 0; c < 4; c++) {
					const uint8_t platform = file_.get8();
					switch(platform) {
						default: break;
						case 1:	platform_type_ |= TargetPlatform::Amiga;		break;
						case 2:	platform_type_ |= TargetPlatform::AtariST;		break;
						/* Omitted: 3 -> IBM PC */
						case 4:	platform_type_ |= TargetPlatform::AmstradCPC;	break;
						case 5:	platform_type_ |= TargetPlatform::ZXSpectrum;	break;
						/* Omitted: 6 -> Sam Coupé */
						/* Omitted: 7 -> Archimedes */
						/* Omitted: 8 -> C64 */
						/* Omitted: 9 -> Atari 8-bit */
					}
				}

				// If the file didn't declare anything, default to supporting everything.
				if(!platform_type_) {
					platform_type_ = ~0;
				}

				// Ignore: disk number, creator ID, reserved area.
			} break;

			case block("IMGE"): {
				// Get track location.
				const uint32_t track = file_.get32be();
				const uint32_t side = file_.get32be();
				const Track::Address address{int(side), HeadPosition(int(track))};

				// Hence generate a TrackDescription.
				auto pair = tracks_.emplace(address, TrackDescription());
				TrackDescription &description = pair.first->second;

				// Read those fields of interest...

				// Bit density. I've no idea why the density can't just be given as a measurement.
				description.density = TrackDescription::Density(file_.get32be());
				if(description.density > TrackDescription::Density::Max) {
					description.density = TrackDescription::Density::Unknown;
				}

				file_.seek(12, SEEK_CUR);	// Skipped: signal type, track bytes, start byte position.
				description.start_bit_pos = file_.get32be();
				description.data_bits = file_.get32be();
				description.gap_bits = file_.get32be();

				file_.seek(4, SEEK_CUR);	// Skipped: track bits, which is entirely redundant.
				description.block_count = file_.get32be();

				file_.seek(4, SEEK_CUR);	// Skipped: encoder process.
				description.has_fuzzy_bits = file_.get32be() & 1;

				// For some reason the authors decided to introduce another primary key,
				// in addition to that which naturally exists of (track, side). So set up
				// a mapping from the one to the other.
				const uint32_t data_key = file_.get32be();
				tracks_by_data_key.emplace(data_key, address);
			} break;

			case block("DATA"): {
				length += file_.get32be();

				file_.seek(8, SEEK_CUR);	// Skipped: bit size, CRC.

				// Grab the data key and use that to establish the file starting
				// position for this track.
				//
				// Assumed here: DATA records will come after corresponding IMGE records.
				const uint32_t data_key = file_.get32be();
				const auto pair = tracks_by_data_key.find(data_key);
				if(pair == tracks_by_data_key.end()) {
					break;
				}

				auto description = tracks_.find(pair->second);
				if(description == tracks_.end()) {
					break;
				}
				description->second.file_offset = file_.tell();
			} break;
		}

		file_.seek(start_of_block + length, SEEK_SET);
	}
}